

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildArgOut
          (IRBuilderAsmJs *this,Opnd *srcOpnd,uint32 dstRegSlot,uint32 offset,IRType type,
          ValueType valueType)

{
  SymTable *this_00;
  code *pcVar1;
  bool bVar2;
  uint16 argSlotNum;
  StackSym *sym;
  StackSym *sym_00;
  RegOpnd *dstOpnd;
  Instr *instr_00;
  undefined4 *puVar3;
  SymOpnd *this_01;
  uint uVar4;
  Instr *local_40;
  Instr *instr;
  ValueType valueType_local;
  
  instr._0_4_ = offset;
  instr._6_2_ = valueType.field_0;
  if (dstRegSlot < 0x10000) {
    if (type == TyVar) {
      this_00 = this->m_func->m_symTable;
      argSlotNum = UInt16Math::Add((uint16)dstRegSlot,1);
      sym = SymTable::GetArgSlotSym(this_00,argSlotNum);
      sym_00 = StackSym::New(this->m_func);
      dstOpnd = IR::RegOpnd::New(sym_00,TyVar,this->m_func);
      instr_00 = IR::Instr::New(ToVar,&dstOpnd->super_Opnd,srcOpnd,this->m_func);
      AddInstr(this,instr_00,(uint32)instr);
      srcOpnd = &dstOpnd->super_Opnd;
    }
    else {
      uVar4 = (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
              super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count;
      if ((dstRegSlot & 0xffff) < uVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x7eb,"(dstArgSlot >= m_argStack->Count())",
                           "dstArgSlot >= m_argStack->Count()");
        if (!bVar2) goto LAB_004bab0b;
        *puVar3 = 0;
        uVar4 = (this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
                count;
      }
      if (0xfffe < uVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x7ed,"(slotIndex < (65535))","slotIndex < (65535)");
        if (!bVar2) goto LAB_004bab0b;
        *puVar3 = 0;
      }
      sym = StackSym::NewArgSlotSym((ArgSlot)uVar4,this->m_func,type);
      sym->field_0x19 = sym->field_0x19 | 0x10;
    }
    this_01 = IR::SymOpnd::New(&sym->super_Sym,type,this->m_func);
    bVar2 = ValueType::IsUninitialized((ValueType *)((long)&instr + 6));
    if (!bVar2) {
      IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)instr._6_2_);
    }
    local_40 = IR::Instr::New(ArgOut_A,&this_01->super_Opnd,srcOpnd,this->m_func);
    AddInstr(this,local_40,(uint32)instr);
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              (&this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>,
               &local_40);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                     ,0x7db,"((0))","Arg count too big...");
  if (bVar2) {
    *puVar3 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_004bab0b:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void IRBuilderAsmJs::BuildArgOut(IR::Opnd* srcOpnd, uint32 dstRegSlot, uint32 offset, IRType type, ValueType valueType)
{
    Js::ArgSlot dstArgSlot = (Js::ArgSlot)dstRegSlot;
    if ((uint32)dstArgSlot != dstRegSlot)
    {
        AssertMsg(UNREACHED, "Arg count too big...");
        Fatal();
    }
    StackSym * symDst = nullptr;
    if (type == TyVar)
    {
        symDst = m_func->m_symTable->GetArgSlotSym(ArgSlotMath::Add(dstArgSlot, 1));
        IR::Opnd * tmpDst = IR::RegOpnd::New(StackSym::New(m_func), TyVar, m_func);

        IR::Instr * instr = IR::Instr::New(Js::OpCode::ToVar, tmpDst, srcOpnd, m_func);
        AddInstr(instr, offset);
        srcOpnd = tmpDst;
    }
    else
    {
        // Some arg types may use multiple slots, so can't rely on count from bytecode
        Assert(dstArgSlot >= m_argStack->Count());
        uint slotIndex = m_argStack->Count();
        AssertOrFailFast(slotIndex < UINT16_MAX);

        symDst = StackSym::NewArgSlotSym((Js::ArgSlot)slotIndex, m_func, type);
        symDst->m_allocated = true;
    }

    IR::Opnd * dstOpnd = IR::SymOpnd::New(symDst, type, m_func);
    if (!valueType.IsUninitialized())
    {
        dstOpnd->SetValueType(valueType);
    }

    IR::Instr * instr = IR::Instr::New(Js::OpCode::ArgOut_A, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);

    m_argStack->Push(instr);
}